

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::readMetadata
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *client;
  Url UStack_38;
  
  if (this->version_ == v2) {
    client = this->client_;
    getMetadataUrl(&UStack_38,this,path);
    HttpConsumer::get(__return_storage_ptr__,client,&UStack_38);
    std::__cxx11::string::~string((string *)&UStack_38);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::KeyValue::readMetadata(const Path &path) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::get(client_, getMetadataUrl(path));
}